

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::NameEntry::~NameEntry(NameEntry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__NameEntry_001461f8;
  pcVar2 = (this->_name)._M_dataplus._M_p;
  paVar1 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~NameEntry() { }